

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O0

nb_type * __thiscall libDAI::NDP::NBFromVarSet(NDP *this,VarSet *vs)

{
  pointer puVar1;
  bool bVar2;
  reference pVVar3;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  nb_type *in_RDI;
  size_t vI;
  Var *v;
  size_t i;
  const_iterator it;
  nb_type *n;
  VarSet *in_stack_ffffffffffffff58;
  Var *in_stack_ffffffffffffff60;
  allocator_type *in_stack_ffffffffffffff70;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_38 [3];
  undefined1 local_19;
  
  local_19 = 0;
  VarSet::size((VarSet *)0xbb8cce);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbb8ce5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_RSI,(size_type)in_RDI,in_stack_ffffffffffffff70);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbb8d08);
  local_38[0]._M_current = (Var *)VarSet::begin(in_stack_ffffffffffffff58);
  while( true ) {
    VarSet::end(in_stack_ffffffffffffff58);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar2) break;
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(local_38);
    puVar1 = in_RSI[0x11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    in_stack_ffffffffffffff60 = (Var *)(**(code **)(*puVar1 + 0x40))(puVar1,pVVar3);
    this_00 = (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
               *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    this_00->_M_current = in_stack_ffffffffffffff60;
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator++(this_00,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  }
  return in_RDI;
}

Assistant:

nb_type NBFromVarSet(const VarSet & vs) const
            {
                nb_type n(vs.size());
                VarSet::const_iterator it = vs.begin();
                for(size_t i=0; it != vs.end(); it++, i++)
                {
                    const Var & v = *it;
                    size_t vI = _g->findVar(v);
                    n.at(i) = vI;
                }
                return n;
            }